

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O3

void __thiscall Fl_Check_Browser::checked(Fl_Check_Browser *this,int i,int b)

{
  cb_item *pcVar1;
  
  pcVar1 = find_item(this,i);
  if ((pcVar1 != (cb_item *)0x0) && (pcVar1->checked != b)) {
    pcVar1->checked = (char)b;
    this->nchecked_ = this->nchecked_ + (-(uint)(b == 0) | 1);
    Fl_Widget::redraw((Fl_Widget *)this);
    return;
  }
  return;
}

Assistant:

void Fl_Check_Browser::checked(int i, int b) {
	cb_item *p = find_item(i);

	if (p && (p->checked ^ b)) {
		p->checked = b;
		if (b) {
			nchecked_++;
		} else {
			nchecked_--;
		}
		redraw();
	}
}